

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O3

DecodeStatus DecodeCacheOpR6(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  DecodeStatus extraout_EAX;
  MCRegisterClass *pMVar1;
  
  pMVar1 = MCRegisterInfo_getRegClass((MCRegisterInfo *)Address,8);
  MCOperand_CreateReg0
            (Inst,(uint)*(ushort *)((long)pMVar1->RegsBegin + (ulong)(Insn >> 0x14 & 0x3e)));
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 7 & 0x1ff));
  MCOperand_CreateImm0(Inst,(ulong)(Insn >> 0x10 & 0x1f));
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeCacheOpR6(MCInst *Inst,
		unsigned Insn, uint64_t Address, MCRegisterInfo *Decoder)
{
	int Offset = fieldFromInstruction(Insn, 7, 9);
	unsigned Hint = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);
	MCOperand_CreateImm0(Inst, Hint);

	return MCDisassembler_Success;
}